

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscribedsignal.cpp
# Opt level: O0

void __thiscall
hbm::streaming::SubscribedSignal::SubscribedSignal(SubscribedSignal *this,uint signalNumber)

{
  undefined4 in_ESI;
  undefined4 *in_RDI;
  
  *in_RDI = in_ESI;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  deltaTimeInfo::deltaTimeInfo((deltaTimeInfo *)0x1444a9);
  in_RDI[0x16] = 0;
  *(undefined1 *)(in_RDI + 0x17) = 0;
  in_RDI[0x18] = 2;
  *(undefined8 *)(in_RDI + 0x1a) = 4;
  in_RDI[0x1c] = 0;
  *(undefined8 *)(in_RDI + 0x1e) = 0;
  return;
}

Assistant:

SubscribedSignal::SubscribedSignal(unsigned int signalNumber)
			: m_signalNumber(signalNumber)
			, m_signalReference()
			, m_syncSignalTime()

			, m_dataFormatPattern()
			, m_dataIsBigEndian(false)
			, m_dataValueType(DATATYPE_REAL32)
			, m_dataValueSize(4) // may not be zero because it is used as divisor.
			, m_dataTimeType()
			, m_dataTimeSize(0)
		{
		}